

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O0

ON_SHA1_Hash * __thiscall ON_TextMask::ContentHash(ON_TextMask *this)

{
  bool bVar1;
  uint u_00;
  ON_SHA1_Hash local_b0;
  uint local_9c;
  ON__UINT32 local_98;
  uint u [3];
  ON_SHA1 sha1;
  ON_TextMask *this_local;
  
  bVar1 = ON_SHA1_Hash::IsZeroDigest(&this->m_content_hash);
  if (bVar1) {
    ON_SHA1::ON_SHA1((ON_SHA1 *)(u + 1));
    local_9c = (uint)((this->m_bDrawMask & 1U) != 0);
    local_98 = (ON__UINT32)this->m_mask_type;
    u[0] = (uint)this->m_mask_frame;
    ON_SHA1::AccumulateUnsigned32((ON_SHA1 *)(u + 1),local_9c);
    ON_SHA1::AccumulateUnsigned32((ON_SHA1 *)(u + 1),local_98);
    ON_SHA1::AccumulateUnsigned32((ON_SHA1 *)(u + 1),u[0]);
    u_00 = ON_Color::operator_cast_to_unsigned_int(&this->m_mask_color);
    ON_SHA1::AccumulateUnsigned32((ON_SHA1 *)(u + 1),u_00);
    ON_SHA1::AccumulateDouble((ON_SHA1 *)(u + 1),this->m_mask_border);
    ON_SHA1::Hash(&local_b0,(ON_SHA1 *)(u + 1));
    *(undefined8 *)(this->m_content_hash).m_digest = local_b0.m_digest._0_8_;
    *(undefined8 *)((this->m_content_hash).m_digest + 8) = local_b0.m_digest._8_8_;
    *(undefined4 *)((this->m_content_hash).m_digest + 0x10) = local_b0.m_digest._16_4_;
  }
  return &this->m_content_hash;
}

Assistant:

const ON_SHA1_Hash& ON_TextMask::ContentHash() const
{
  if (m_content_hash.IsZeroDigest())
  {
    ON_SHA1 sha1;
    unsigned int u[3] = {
      (m_bDrawMask ? 1U : 0U),
      (unsigned int)(static_cast<unsigned char>(m_mask_type)),
      (unsigned int)(static_cast<unsigned char>(m_mask_frame))
    };
    sha1.AccumulateUnsigned32(u[0]);
    sha1.AccumulateUnsigned32(u[1]);
    sha1.AccumulateUnsigned32(u[2]);
    sha1.AccumulateUnsigned32(m_mask_color);
    sha1.AccumulateDouble(m_mask_border);
    m_content_hash = sha1.Hash();
  }
  return m_content_hash;
}